

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

fp fmt::v5::internal::operator*(fp x,fp y)

{
  ulong uVar1;
  ulong uVar2;
  int in_ECX;
  ulong in_RDX;
  int in_ESI;
  ulong in_RDI;
  fp fVar3;
  uint64_t mid;
  uint64_t bd;
  uint64_t ad;
  uint64_t bc;
  uint64_t ac;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mask;
  undefined1 local_10 [12];
  
  uVar1 = (in_RDI & 0xffffffff) * (in_RDX >> 0x20);
  uVar2 = (in_RDI >> 0x20) * (in_RDX & 0xffffffff);
  fp::fp((fp *)local_10,
         (in_RDI >> 0x20) * (in_RDX >> 0x20) + (uVar2 >> 0x20) + (uVar1 >> 0x20) +
         (((in_RDI & 0xffffffff) * (in_RDX & 0xffffffff) >> 0x20) + (uVar2 & 0xffffffff) +
          (uVar1 & 0xffffffff) + 0x80000000 >> 0x20),in_ESI + 0x40 + in_ECX);
  fVar3._12_4_ = 0;
  fVar3.f = local_10._0_8_;
  fVar3.e = local_10._8_4_;
  return fVar3;
}

Assistant:

FMT_FUNC fp operator*(fp x, fp y) {
  // Multiply 32-bit parts of significands.
  uint64_t mask = (1ULL << 32) - 1;
  uint64_t a = x.f >> 32, b = x.f & mask;
  uint64_t c = y.f >> 32, d = y.f & mask;
  uint64_t ac = a * c, bc = b * c, ad = a * d, bd = b * d;
  // Compute mid 64-bit of result and round.
  uint64_t mid = (bd >> 32) + (ad & mask) + (bc & mask) + (1U << 31);
  return fp(ac + (ad >> 32) + (bc >> 32) + (mid >> 32), x.e + y.e + 64);
}